

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

uint32_t ly_ctx_get_modules_hash(ly_ctx *ctx)

{
  lyd_node *plVar1;
  lysc_node *__s;
  lyd_node_inner *__s_00;
  char *__s_01;
  uint32_t uVar2;
  size_t sVar3;
  lysp_feature *last;
  ulong uVar4;
  uint32_t local_34;
  
  if (ctx == (ly_ctx *)0x0) {
    uVar2 = 0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_get_modules_hash");
  }
  else {
    local_34 = 0;
    uVar4 = (ulong)((ctx->flags & 4) == 0) * 2 + 6;
    uVar2 = 0;
    while ((uVar4 < (ctx->list).count &&
           (plVar1 = (ctx->list).field_2.dnodes[uVar4], plVar1 != (lyd_node *)0x0))) {
      __s = plVar1->schema;
      sVar3 = strlen((char *)__s);
      uVar2 = lyht_hash_multi(uVar2,(char *)__s,sVar3);
      __s_00 = plVar1->parent;
      if (__s_00 != (lyd_node_inner *)0x0) {
        sVar3 = strlen((char *)__s_00);
        uVar2 = lyht_hash_multi(uVar2,(char *)__s_00,sVar3);
      }
      uVar4 = uVar4 + 1;
      last = (lysp_feature *)0x0;
      while( true ) {
        last = lysp_feature_next(last,(lysp_module *)plVar1[1].next,&local_34);
        if (last == (lysp_feature *)0x0) break;
        if ((last->flags & 0x20) != 0) {
          __s_01 = last->name;
          sVar3 = strlen(__s_01);
          uVar2 = lyht_hash_multi(uVar2,__s_01,sVar3);
        }
      }
      uVar2 = lyht_hash_multi(uVar2,(char *)&plVar1[2].schema,1);
    }
    uVar2 = lyht_hash_multi(uVar2,(char *)0x0,0);
  }
  return uVar2;
}

Assistant:

LIBYANG_API_DEF uint32_t
ly_ctx_get_modules_hash(const struct ly_ctx *ctx)
{
    const struct lys_module *mod;
    uint32_t i = ly_ctx_internal_modules_count(ctx), hash = 0, fi = 0;
    struct lysp_feature *f = NULL;

    LY_CHECK_ARG_RET(ctx, ctx, 0);

    while ((mod = ly_ctx_get_module_iter(ctx, &i))) {
        /* name */
        hash = lyht_hash_multi(hash, mod->name, strlen(mod->name));

        /* revision */
        if (mod->revision) {
            hash = lyht_hash_multi(hash, mod->revision, strlen(mod->revision));
        }

        /* enabled features */
        while ((f = lysp_feature_next(f, mod->parsed, &fi))) {
            if (f->flags & LYS_FENABLED) {
                hash = lyht_hash_multi(hash, f->name, strlen(f->name));
            }
        }

        /* imported/implemented */
        hash = lyht_hash_multi(hash, (char *)&mod->implemented, sizeof mod->implemented);
    }

    hash = lyht_hash_multi(hash, NULL, 0);
    return hash;
}